

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O1

void IoTHubClientCore_LL_ConnectionStatusCallBack
               (IOTHUB_CLIENT_CONNECTION_STATUS status,IOTHUB_CLIENT_CONNECTION_STATUS_REASON reason
               ,void *ctx)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  undefined4 in_register_00000034;
  undefined4 in_register_0000003c;
  
  if (ctx == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                 ,"IoTHubClientCore_LL_ConnectionStatusCallBack",0x26c,1,"invalid arg");
      return;
    }
  }
  else if (*(code **)((long)ctx + 0x148) != (code *)0x0) {
    (**(code **)((long)ctx + 0x148))
              (CONCAT44(in_register_0000003c,status),CONCAT44(in_register_00000034,reason),
               *(undefined8 *)((long)ctx + 0x150));
    return;
  }
  return;
}

Assistant:

static void IoTHubClientCore_LL_ConnectionStatusCallBack(IOTHUB_CLIENT_CONNECTION_STATUS status, IOTHUB_CLIENT_CONNECTION_STATUS_REASON reason, void* ctx)
{
    if (ctx == NULL)
    {
        /*"shall return"*/
        LogError("invalid arg");
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)ctx;

        if (handleData->conStatusCallback != NULL)
        {
            handleData->conStatusCallback(status, reason, handleData->conStatusUserContextCallback);
        }
    }

}